

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O2

date_t duckdb::AddOperator::Operation<duckdb::date_t,int,duckdb::date_t>(date_t left,int32_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  allocator local_3d;
  date_t result;
  string local_38;
  
  bVar1 = TryAddOperator::Operation<duckdb::date_t,int,duckdb::date_t>(left,right,&result);
  if (bVar1) {
    return (date_t)result.days;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Date out of range",&local_3d);
  OutOfRangeException::OutOfRangeException(this,&local_38);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

date_t AddOperator::Operation(date_t left, int32_t right) {
	date_t result;
	if (!TryAddOperator::Operation(left, right, result)) {
		throw OutOfRangeException("Date out of range");
	}
	return result;
}